

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slb_test.cc
# Opt level: O0

int main(void)

{
  test_add_backend_servers();
  test_create_load_balancer();
  test_create_load_balancer_ht_tp_listener();
  test_create_load_balancer_tc_plistener();
  test_delete_load_balancer();
  test_delete_load_balancer_listener();
  test_describe_backend_servers();
  test_describe_load_balancer_attribute();
  test_describe_load_balancer_ht_tp_listener_attribute();
  test_describe_load_balancers();
  test_describe_load_balancer_tc_plistener_attribute();
  test_describe_regions();
  test_remove_backend_servers();
  test_set_load_balancer_ht_tp_listener_attribute();
  test_set_load_balancer_listener_status();
  test_set_load_balancer_name();
  test_set_load_balancer_status();
  test_set_load_balancer_tc_plistener_attribute();
  test_set_load_banancer_listener_status();
  return 0;
}

Assistant:

int main() {
  test_add_backend_servers();
  test_create_load_balancer();
  test_create_load_balancer_ht_tp_listener();
  test_create_load_balancer_tc_plistener();
  test_delete_load_balancer();
  test_delete_load_balancer_listener();
  test_describe_backend_servers();
  test_describe_load_balancer_attribute();
  test_describe_load_balancer_ht_tp_listener_attribute();
  test_describe_load_balancers();
  test_describe_load_balancer_tc_plistener_attribute();
  test_describe_regions();
  test_remove_backend_servers();
  test_set_load_balancer_ht_tp_listener_attribute();
  test_set_load_balancer_listener_status();
  test_set_load_balancer_name();
  test_set_load_balancer_status();
  test_set_load_balancer_tc_plistener_attribute();
  test_set_load_banancer_listener_status();
}